

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool-gnu-make-posix.cc
# Opt level: O0

bool __thiscall GNUmakeTokenPoolPosix::CheckFd(GNUmakeTokenPoolPosix *this,int fd)

{
  int iVar1;
  int ret;
  int fd_local;
  GNUmakeTokenPoolPosix *this_local;
  
  if (fd < 0) {
    this_local._7_1_ = false;
  }
  else {
    iVar1 = fcntl(fd,1);
    if (iVar1 < 0) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool GNUmakeTokenPoolPosix::CheckFd(int fd) {
  if (fd < 0)
    return false;
  int ret = fcntl(fd, F_GETFD);
  if (ret < 0)
    return false;
  return true;
}